

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void learn(OjaNewton *ON,base_learner *base,example *ec)

{
  float fVar1;
  loss_function *plVar2;
  example *in_RDX;
  OjaNewton *in_RDI;
  float extraout_XMM0_Da;
  int k_1;
  OjaNewton *unaff_retaddr;
  example *ex;
  int k;
  update_data_conflict *data;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  example *in_stack_ffffffffffffffd0;
  int local_24;
  OjaNewton *this;
  
  predict((OjaNewton *)in_stack_ffffffffffffffd0,
          (base_learner *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (example *)0x34e917);
  this = (OjaNewton *)&in_RDI->data;
  plVar2 = in_RDI->all->loss;
  (*plVar2->_vptr_loss_function[6])
            ((in_RDX->pred).scalar,(in_RDX->l).simple.label,plVar2,in_RDI->all->sd);
  this->m = (int)(extraout_XMM0_Da * (in_RDX->l).simple.weight);
  this->m = (int)((float)this->m / 2.0);
  if ((in_RDI->normalize & 1U) != 0) {
    GD::foreach_feature<update_data,_&update_normalization>
              ((vw *)in_stack_ffffffffffffffd0,
               (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (update_data_conflict *)0x34e9b6);
  }
  in_RDI->buffer[in_RDI->cnt] = in_RDX;
  fVar1 = (float)this->m;
  iVar3 = in_RDI->cnt;
  in_RDI->cnt = iVar3 + 1;
  in_RDI->weight_buffer[iVar3] = fVar1 / 2.0;
  if (in_RDI->cnt == in_RDI->epoch_size) {
    local_24 = 0;
    while (local_24 < in_RDI->epoch_size) {
      in_stack_ffffffffffffffd0 = in_RDI->buffer[local_24];
      this->epoch_size = (int)in_RDI->weight_buffer[local_24];
      this->alpha = 0.0;
      memset(*(float **)&this->t,0,(long)(in_RDI->m + 1) << 2);
      GD::foreach_feature<update_data,_&compute_Zx_and_norm>
                ((vw *)in_stack_ffffffffffffffd0,
                 (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (update_data_conflict *)0x34eab2);
      OjaNewton::compute_AZx(in_RDI);
      OjaNewton::update_eigenvalues(this);
      OjaNewton::compute_delta((OjaNewton *)in_stack_ffffffffffffffd0);
      OjaNewton::update_K(in_RDI);
      GD::foreach_feature<update_data,_&update_Z_and_wbar>
                ((vw *)in_stack_ffffffffffffffd0,
                 (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (update_data_conflict *)0x34eaf1);
      local_24 = local_24 + 1;
      in_RDI->t = in_RDI->t + 1;
    }
    OjaNewton::update_A(unaff_retaddr);
  }
  memset(*(float **)&this->t,0,(long)(in_RDI->m + 1) << 2);
  GD::foreach_feature<update_data,_&update_wbar_and_Zx>
            ((vw *)in_stack_ffffffffffffffd0,
             (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (update_data_conflict *)0x34eb52);
  OjaNewton::compute_AZx(in_RDI);
  OjaNewton::update_b(in_RDI);
  OjaNewton::check(ON);
  if (in_RDI->cnt == in_RDI->epoch_size) {
    in_RDI->cnt = 0;
    for (iVar3 = 0; iVar3 < in_RDI->epoch_size; iVar3 = iVar3 + 1) {
      VW::finish_example((vw *)in_stack_ffffffffffffffd0,
                         (example *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void learn(OjaNewton& ON, base_learner& base, example& ec)
{
  assert(ec.in_use);

  // predict
  predict(ON, base, ec);

  update_data& data = ON.data;
  data.g = ON.all->loss->first_derivative(ON.all->sd, ec.pred.scalar, ec.l.simple.label) * ec.l.simple.weight;
  data.g /= 2;  // for half square loss

  if (ON.normalize)
    GD::foreach_feature<update_data, update_normalization>(*ON.all, ec, data);

  ON.buffer[ON.cnt] = &ec;
  ON.weight_buffer[ON.cnt++] = data.g / 2;

  if (ON.cnt == ON.epoch_size)
  {
    for (int k = 0; k < ON.epoch_size; k++, ON.t++)
    {
      example& ex = *(ON.buffer[k]);
      data.sketch_cnt = ON.weight_buffer[k];

      data.norm2_x = 0;
      memset(data.Zx, 0, sizeof(float) * (ON.m + 1));
      GD::foreach_feature<update_data, compute_Zx_and_norm>(*ON.all, ex, data);
      ON.compute_AZx();

      ON.update_eigenvalues();
      ON.compute_delta();

      ON.update_K();

      GD::foreach_feature<update_data, update_Z_and_wbar>(*ON.all, ex, data);
    }

    ON.update_A();
    // ON.update_D();
  }

  memset(data.Zx, 0, sizeof(float) * (ON.m + 1));
  GD::foreach_feature<update_data, update_wbar_and_Zx>(*ON.all, ec, data);
  ON.compute_AZx();

  ON.update_b();
  ON.check();

  if (ON.cnt == ON.epoch_size)
  {
    ON.cnt = 0;
    for (int k = 0; k < ON.epoch_size; k++)
    {
      VW::finish_example(*ON.all, *ON.buffer[k]);
    }
  }
}